

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cumain.cpp
# Opt level: O0

void cu_stop_tracing(int param_1)

{
  vector<Sample,_std::allocator<Sample>_> *pvVar1;
  map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar2;
  int param_0_local;
  
  std::atomic<bool>::operator=(&tracing_enabled,false);
  if ((samples != (vector<Sample,_std::allocator<Sample>_> *)0x0) &&
     (symbols_abi_cxx11_ !=
      (map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)0x0)) {
    cu_trace_report();
    pvVar1 = samples;
    if (samples != (vector<Sample,_std::allocator<Sample>_> *)0x0) {
      std::vector<Sample,_std::allocator<Sample>_>::~vector(samples);
      operator_delete(pvVar1);
    }
    pmVar2 = symbols_abi_cxx11_;
    if (symbols_abi_cxx11_ !=
        (map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x0) {
      std::
      map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map(symbols_abi_cxx11_);
      operator_delete(pmVar2);
    }
    samples = (vector<Sample,_std::allocator<Sample>_> *)0x0;
    symbols_abi_cxx11_ =
         (map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x0;
    count_samples = 0;
  }
  return;
}

Assistant:

static void cu_stop_tracing(int)
{
  tracing_enabled = false;

  if ((samples != NULL) && (symbols != NULL))
  {
    cu_trace_report();
    delete samples;
    delete symbols;
    samples = NULL;
    symbols = NULL;
    count_samples = 0;
  }
}